

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O1

void object_lists_check_integrity(chunk_conflict *c,chunk_conflict *c_k)

{
  _Bool _Var1;
  object *top;
  object *poVar2;
  object *poVar3;
  ulong uVar4;
  
  if (c_k == (chunk_conflict *)0x0) {
    if (c->obj_max != 0) {
      uVar4 = 0;
      do {
        poVar2 = c->objects[uVar4];
        if (poVar2 != (object *)0x0) {
          if (uVar4 != poVar2->oidx) {
            __assert_fail("obj->oidx == i",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                          ,0x213,"void object_lists_check_integrity(struct chunk *, struct chunk *)"
                         );
          }
          _Var1 = loc_is_zero((loc_conflict)poVar2->grid);
          if (!_Var1) {
            poVar3 = square_object(c,poVar2->grid);
            _Var1 = pile_contains(poVar3,poVar2);
            if (!_Var1) {
              __assert_fail("pile_contains(square_object(c, obj->grid), obj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                            ,0x215,
                            "void object_lists_check_integrity(struct chunk *, struct chunk *)");
            }
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < c->obj_max);
    }
  }
  else {
    if (c->obj_max != c_k->obj_max) {
      __assert_fail("c->obj_max == c_k->obj_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                    ,0x1fb,"void object_lists_check_integrity(struct chunk *, struct chunk *)");
    }
    if (c->obj_max != 0) {
      uVar4 = 0;
      do {
        poVar2 = c->objects[uVar4];
        poVar3 = c_k->objects[uVar4];
        if (poVar2 != (object *)0x0) {
          if (uVar4 != poVar2->oidx) {
            __assert_fail("obj->oidx == i",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                          ,0x200,"void object_lists_check_integrity(struct chunk *, struct chunk *)"
                         );
          }
          _Var1 = loc_is_zero((loc_conflict)poVar2->grid);
          if (!_Var1) {
            top = square_object(c,poVar2->grid);
            _Var1 = pile_contains(top,poVar2);
            if (!_Var1) {
              __assert_fail("pile_contains(square_object(c, obj->grid), obj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                            ,0x202,
                            "void object_lists_check_integrity(struct chunk *, struct chunk *)");
            }
          }
        }
        if (poVar3 != (object *)0x0) {
          if (poVar2 == (object *)0x0) {
            __assert_fail("obj",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                          ,0x205,"void object_lists_check_integrity(struct chunk *, struct chunk *)"
                         );
          }
          if ((player->upkeep->playing == true) && (poVar3 != poVar2->known)) {
            __assert_fail("known_obj == obj->known",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                          ,0x207,"void object_lists_check_integrity(struct chunk *, struct chunk *)"
                         );
          }
          _Var1 = loc_is_zero((loc_conflict)poVar3->grid);
          if (!_Var1) {
            poVar2 = square_object(c_k,poVar3->grid);
            _Var1 = pile_contains(poVar2,poVar3);
            if (!_Var1) {
              __assert_fail("pile_contains(square_object(c_k, known_obj->grid), known_obj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                            ,0x20b,
                            "void object_lists_check_integrity(struct chunk *, struct chunk *)");
            }
          }
          if (uVar4 != poVar3->oidx) {
            __assert_fail("known_obj->oidx == i",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                          ,0x20c,"void object_lists_check_integrity(struct chunk *, struct chunk *)"
                         );
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < c->obj_max);
    }
  }
  return;
}

Assistant:

void object_lists_check_integrity(struct chunk *c, struct chunk *c_k)
{
	int i;
	if (c_k) {
		assert(c->obj_max == c_k->obj_max);
		for (i = 0; i < c->obj_max; i++) {
			struct object *obj = c->objects[i];
			struct object *known_obj = c_k->objects[i];
			if (obj) {
				assert(obj->oidx == i);
				if (!loc_is_zero(obj->grid))
					assert(pile_contains(square_object(c, obj->grid), obj));
			}
			if (known_obj) {
				assert (obj);
				if (player->upkeep->playing) {
					assert(known_obj == obj->known);
				}
				if (!loc_is_zero(known_obj->grid))
					assert (pile_contains(square_object(c_k, known_obj->grid),
										  known_obj));
				assert (known_obj->oidx == i);
			}
		}
	} else {
		for (i = 0; i < c->obj_max; i++) {
			struct object *obj = c->objects[i];
			if (obj) {
				assert(obj->oidx == i);
				if (!loc_is_zero(obj->grid))
					assert(pile_contains(square_object(c, obj->grid), obj));
			}
		}
	}
}